

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory_method.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Point *p)

{
  ostream *poVar1;
  Point *p_local;
  ostream *out_local;
  
  poVar1 = std::operator<<(out,"(x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,p->x);
  poVar1 = std::operator<<(poVar1,", y = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,p->y);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Point& p)
	{
		return out << "(x = " << p.x << ", y = " << p.y << ")";
	}